

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_tests.cpp
# Opt level: O1

void __thiscall net_tests::cnetaddr_unserialize_v2::test_method(cnetaddr_unserialize_v2 *this)

{
  readonly_property<bool> rVar1;
  readonly_property65 rVar2;
  bool bVar3;
  int iVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string file_41;
  const_string file_42;
  const_string file_43;
  const_string file_44;
  const_string file_45;
  const_string file_46;
  const_string file_47;
  const_string file_48;
  const_string file_49;
  const_string file_50;
  const_string file_51;
  const_string file_52;
  const_string file_53;
  const_string file_54;
  const_string file_55;
  const_string file_56;
  const_string file_57;
  const_string file_58;
  const_string file_59;
  const_string file_60;
  const_string file_61;
  const_string file_62;
  const_string file_63;
  const_string file_64;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  const_string msg_41;
  const_string msg_42;
  const_string msg_43;
  const_string msg_44;
  const_string msg_45;
  const_string msg_46;
  const_string msg_47;
  const_string msg_48;
  const_string msg_49;
  const_string msg_50;
  const_string msg_51;
  const_string msg_52;
  const_string msg_53;
  const_string msg_54;
  const_string msg_55;
  const_string msg_56;
  const_string msg_57;
  const_string msg_58;
  const_string msg_59;
  const_string msg_60;
  const_string msg_61;
  const_string msg_62;
  const_string msg_63;
  const_string msg_64;
  SerParams ser_params;
  CNetAddr addr;
  check_type cVar11;
  char *pcVar7;
  lazy_ostream *plVar8;
  char *pcVar9;
  assertion_result *paVar10;
  char *local_eb0;
  char *local_ea8;
  undefined1 *local_ea0;
  undefined1 *local_e98;
  char *local_e90;
  char *local_e88;
  char *local_e80;
  char *local_e78;
  undefined1 *local_e70;
  undefined1 *local_e68;
  char *local_e60;
  char *local_e58;
  char *local_e50;
  char *local_e48;
  undefined1 *local_e40;
  undefined1 *local_e38;
  char *local_e30;
  char *local_e28;
  char *local_e20;
  char *local_e18;
  undefined1 *local_e10;
  undefined1 *local_e08;
  char *local_e00;
  char *local_df8;
  char *local_df0;
  char *local_de8;
  undefined1 *local_de0;
  undefined1 *local_dd8;
  char *local_dd0;
  char *local_dc8;
  char *local_d90;
  char *local_d88;
  undefined1 *local_d80;
  undefined1 *local_d78;
  char *local_d70;
  char *local_d68;
  undefined1 *local_d60;
  undefined1 *local_d58;
  char *local_d50;
  char *local_d48;
  char *local_d40;
  char *local_d38;
  undefined1 *local_d30;
  undefined1 *local_d28;
  char *local_d20;
  char *local_d18;
  char *local_ce0;
  char *local_cd8;
  undefined1 *local_cd0;
  undefined1 *local_cc8;
  char *local_cc0;
  char *local_cb8;
  undefined1 *local_cb0;
  undefined1 *local_ca8;
  char *local_ca0;
  char *local_c98;
  char *local_c90;
  char *local_c88;
  undefined1 *local_c80;
  undefined1 *local_c78;
  char *local_c70;
  char *local_c68;
  char *local_c60;
  char *local_c58;
  undefined1 *local_c50;
  undefined1 *local_c48;
  char *local_c40;
  char *local_c38;
  char *local_c30;
  char *local_c28;
  undefined1 *local_c20;
  undefined1 *local_c18;
  char *local_c10;
  char *local_c08;
  char *local_c00;
  char *local_bf8;
  undefined1 *local_bf0;
  undefined1 *local_be8;
  char *local_be0;
  char *local_bd8;
  undefined1 *local_bd0;
  undefined1 *local_bc8;
  char *local_bc0;
  char *local_bb8;
  char *local_bb0;
  char *local_ba8;
  undefined1 *local_ba0;
  undefined1 *local_b98;
  char *local_b90;
  char *local_b88;
  char *local_b80;
  char *local_b78;
  undefined1 *local_b70;
  undefined1 *local_b68;
  char *local_b60;
  char *local_b58;
  char *local_b50;
  char *local_b48;
  undefined1 *local_b40;
  undefined1 *local_b38;
  char *local_b30;
  char *local_b28;
  char *local_b20;
  char *local_b18;
  undefined1 *local_b10;
  undefined1 *local_b08;
  char *local_b00;
  char *local_af8;
  char *local_ac0;
  char *local_ab8;
  undefined1 *local_ab0;
  undefined1 *local_aa8;
  char *local_aa0;
  char *local_a98;
  undefined1 *local_a90;
  undefined1 *local_a88;
  char *local_a80;
  char *local_a78;
  char *local_a70;
  char *local_a68;
  undefined1 *local_a60;
  undefined1 *local_a58;
  char *local_a50;
  char *local_a48;
  undefined1 *local_a40;
  undefined1 *local_a38;
  char *local_a30;
  char *local_a28;
  char *local_a20;
  char *local_a18;
  undefined1 *local_a10;
  undefined1 *local_a08;
  char *local_a00;
  char *local_9f8;
  char *local_9f0;
  char *local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9d8;
  char *local_9d0;
  char *local_9c8;
  char *local_9c0;
  char *local_9b8;
  undefined1 *local_9b0;
  undefined1 *local_9a8;
  char *local_9a0;
  char *local_998;
  char *local_990;
  char *local_988;
  undefined1 *local_980;
  undefined1 *local_978;
  char *local_970;
  char *local_968;
  char *local_930;
  char *local_928;
  undefined1 *local_920;
  undefined1 *local_918;
  char *local_910;
  char *local_908;
  undefined1 *local_900;
  undefined1 *local_8f8;
  char *local_8f0;
  char *local_8e8;
  char *local_8e0;
  char *local_8d8;
  undefined1 *local_8d0;
  undefined1 *local_8c8;
  char *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  undefined1 *local_880;
  undefined1 *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  undefined1 *local_7c0;
  undefined1 *local_7b8;
  char *local_7b0;
  char *local_7a8;
  char *local_7a0;
  char *local_798;
  undefined1 *local_790;
  undefined1 *local_788;
  char *local_780;
  char *local_778;
  char *local_770;
  char *local_768;
  undefined1 *local_760;
  undefined1 *local_758;
  char *local_750;
  char *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  char *local_710;
  char *local_708;
  undefined1 *local_700;
  undefined1 *local_6f8;
  char *local_6f0;
  char *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  char *local_630;
  char *local_628;
  undefined1 *local_620;
  undefined1 *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  undefined1 *local_520;
  undefined1 *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  char *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  undefined1 *local_280;
  undefined1 *local_278;
  char *local_270;
  char *local_268;
  undefined1 local_260 [16];
  undefined1 *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  SerParams local_190;
  undefined1 local_188 [8];
  _func_int **pp_Stack_180;
  pointer local_178;
  size_type sStack_170;
  ParamsStream<DataStream_&,_CAddress::SerParams> local_160;
  ParamsStream<DataStream_&,_CAddress::SerParams> local_150;
  ParamsStream<DataStream_&,_CAddress::SerParams> local_140;
  ParamsStream<DataStream_&,_CAddress::SerParams> local_130;
  ParamsStream<DataStream_&,_CAddress::SerParams> local_120;
  ParamsStream<DataStream_&,_CAddress::SerParams> local_110;
  char *local_100;
  string *local_f8;
  assertion_result local_f0;
  ParamsStream<DataStream_&,_CAddress::SerParams> local_d8;
  undefined1 local_c8 [8];
  DataStream *pDStack_c0;
  undefined1 *local_b8;
  lazy_ostream *plStack_b0;
  undefined2 local_a8;
  string local_98;
  direct_or_indirect local_78;
  uint local_68;
  int local_60;
  undefined **local_58;
  element_type *local_50;
  shared_count sStack_48;
  ParamsStream<DataStream_&,_CAddress::SerParams> *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  CNetAddr::CNetAddr((CNetAddr *)&local_78.indirect_contents);
  local_178 = (pointer)0x0;
  sStack_170 = 0;
  local_188 = (undefined1  [8])0x0;
  pp_Stack_180 = (_func_int **)0x0;
  local_190.super_SerParams.enc = V2;
  local_190.fmt = Network;
  local_c8._0_6_ = 0x40302010401;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,0,local_c8);
  local_c8 = (undefined1  [8])&local_190;
  pDStack_c0 = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c8);
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x198;
  file.m_begin = (iterator)&local_1a0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_1b0,msg);
  rVar1.super_class_property<bool>.value =
       (class_property<bool>)CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsValid()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_1c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_1b8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  local_58._0_1_ = rVar1.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,_cVar11,
             (size_t)&local_1c0,0x198);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_1d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x199;
  file_00.m_begin = (iterator)&local_1d0;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1e0,
             msg_00);
  local_58._0_1_ = (class_property<bool>)(local_60 == 1);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsIPv4()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_1f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_1e8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,_cVar11,
             (size_t)&local_1f0,0x199);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x19a;
  file_01.m_begin = (iterator)&local_200;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_210,
             msg_01);
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CNetAddr::IsAddrV1Compatible((CNetAddr *)&local_78.indirect_contents);
  paVar10 = (assertion_result *)&local_58;
  local_58 = (undefined **)
             CONCAT71(local_58._1_7_,
                      rVar2.super_readonly_property<bool>.super_class_property<bool>.value);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsAddrV1Compatible()";
  local_260._8_8_ = "";
  plVar8 = (lazy_ostream *)local_c8;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_220 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_218 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            (paVar10,plVar8,1,0,WARN,_cVar11,(size_t)&local_220,0x19a);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_230 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x19b;
  file_02.m_begin = (iterator)&local_230;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_240,
             msg_02);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_013abb30;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  CNetAddr::ToStringAddr_abi_cxx11_(&local_98,(CNetAddr *)&local_78.indirect_contents);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"1.2.3.4");
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 0);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_params = (SerParams *)0xeb1b5a;
  local_d8.m_substream = (DataStream *)0xeb1bbc;
  plStack_b0 = (lazy_ostream *)&local_110;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abbf0;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  local_120.m_params = (SerParams *)0xeb8a1e;
  local_50 = (element_type *)((ulong)local_50 & 0xffffffffffffff00);
  local_58 = &PTR__lazy_ostream_013ac3b0;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcVar9 = "\"1.2.3.4\"";
  pcVar7 = "addr.ToStringAddr()";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_110.m_params = (SerParams *)&local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)local_260,1,2,REQUIRE,0xeb694c,(size_t)&local_d8,0x19b,plVar8
             ,"\"1.2.3.4\"",paVar10);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_270 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_268 = "";
  local_280 = &boost::unit_test::basic_cstring<char_const>::null;
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x19c;
  file_03.m_begin = (iterator)&local_270;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_280,
             msg_03);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_290 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_288 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  local_58._0_1_ =
       (class_property<bool>)
       (class_property<bool>)((long)pp_Stack_180 - (long)local_188 == sStack_170);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_290,0x19c,plVar8,pcVar9,paVar10);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_c8._0_4_ = 0x2010401;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_2a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x1a2;
  file_04.m_begin = (iterator)&local_2a0;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2b0,
             msg_04);
  local_160.m_params = &local_190;
  local_160.m_substream = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,&local_160);
  local_2c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x1a2;
  file_05.m_begin = (iterator)&local_2c0;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2d0,
             msg_05);
  local_58._0_1_ = (class_property<bool>)0x0;
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abd70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  plStack_b0 = (lazy_ostream *)0xe54324;
  local_2e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_2d8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_2e0,0x1a2);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_320 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x1a3;
  file_06.m_begin = (iterator)&local_320;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_330,
             msg_06);
  local_58._0_1_ = (class_property<bool>)((long)pp_Stack_180 - (long)local_188 != sStack_170);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_340 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_338 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_340,0x1a3);
  boost::detail::shared_count::~shared_count(&sStack_48);
  if ((undefined1  [8])pp_Stack_180 != local_188) {
    pp_Stack_180 = (_func_int **)local_188;
  }
  sStack_170 = 0;
  local_c8._0_6_ = 0x40302010501;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_350 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x1ab;
  file_07.m_begin = (iterator)&local_350;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_360,
             msg_07);
  local_150.m_params = &local_190;
  local_150.m_substream = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,&local_150);
  local_370 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_368 = "";
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  local_378 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x1ab;
  file_08.m_begin = (iterator)&local_370;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_380,
             msg_08);
  local_58._0_1_ = (class_property<bool>)0x0;
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abd70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  plStack_b0 = (lazy_ostream *)0xe54324;
  local_390 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_388 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_390,0x1ab);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_3d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_3c8 = "";
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x1ac;
  file_09.m_begin = (iterator)&local_3d0;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3e0,
             msg_09);
  local_58._0_1_ = (class_property<bool>)((long)pp_Stack_180 - (long)local_188 != sStack_170);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_3f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_3e8 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_3f0,0x1ac);
  boost::detail::shared_count::~shared_count(&sStack_48);
  if ((undefined1  [8])pp_Stack_180 != local_188) {
    pp_Stack_180 = (_func_int **)local_188;
  }
  sStack_170 = 0;
  local_c8 = (undefined1  [8])0x40302010201fd01;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_400 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x1b4;
  file_10.m_begin = (iterator)&local_400;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_410,
             msg_10);
  local_140.m_params = &local_190;
  local_140.m_substream = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,&local_140);
  local_420 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x1b4;
  file_11.m_begin = (iterator)&local_420;
  msg_11.m_end = pvVar6;
  msg_11.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_430,
             msg_11);
  local_58._0_1_ = (class_property<bool>)0x0;
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abd70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  plStack_b0 = (lazy_ostream *)0xe54324;
  local_440 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_438 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_440,0x1b4);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_480 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x1b5;
  file_12.m_begin = (iterator)&local_480;
  msg_12.m_end = pvVar6;
  msg_12.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_490,
             msg_12);
  local_58._0_1_ = (class_property<bool>)((long)pp_Stack_180 - (long)local_188 != sStack_170);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_4a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_498 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_4a0,0x1b5);
  boost::detail::shared_count::~shared_count(&sStack_48);
  if ((undefined1  [8])pp_Stack_180 != local_188) {
    pp_Stack_180 = (_func_int **)local_188;
  }
  sStack_170 = 0;
  local_c8 = (undefined1  [8])0x605040302011002;
  pDStack_c0 = (DataStream *)0xe0d0c0b0a090807;
  local_b8 = (undefined1 *)CONCAT62(local_b8._2_6_,0x100f);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_c8 = (undefined1  [8])&local_190;
  pDStack_c0 = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c8);
  local_4b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_4a8 = "";
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x1bd;
  file_13.m_begin = (iterator)&local_4b0;
  msg_13.m_end = pvVar6;
  msg_13.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_4c0,
             msg_13);
  local_58._0_1_ = (class_property<bool>)CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsValid()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_4d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_4c8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_4d0,0x1bd);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_4e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x1be;
  file_14.m_begin = (iterator)&local_4e0;
  msg_14.m_end = pvVar6;
  msg_14.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_4f0,
             msg_14);
  local_58._0_1_ = (class_property<bool>)(local_60 == 2);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsIPv6()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_500 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_4f8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_500,0x1be);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_510 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_508 = "";
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x1bf;
  file_15.m_begin = (iterator)&local_510;
  msg_15.m_end = pvVar6;
  msg_15.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_520,
             msg_15);
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CNetAddr::IsAddrV1Compatible((CNetAddr *)&local_78.indirect_contents);
  paVar10 = (assertion_result *)&local_58;
  local_58 = (undefined **)
             CONCAT71(local_58._1_7_,
                      rVar2.super_readonly_property<bool>.super_class_property<bool>.value);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsAddrV1Compatible()";
  local_260._8_8_ = "";
  plVar8 = (lazy_ostream *)local_c8;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_530 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_528 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            (paVar10,plVar8,1,0,WARN,(check_type)pcVar7,(size_t)&local_530,0x1bf);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_540 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x1c0;
  file_16.m_begin = (iterator)&local_540;
  msg_16.m_end = pvVar6;
  msg_16.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_550,
             msg_16);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_013abb30;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  CNetAddr::ToStringAddr_abi_cxx11_(&local_98,(CNetAddr *)&local_78.indirect_contents);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"102:304:506:708:90a:b0c:d0e:f10");
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 0);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_params = (SerParams *)0xeb1b5a;
  local_d8.m_substream = (DataStream *)0xeb1bbc;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abbf0;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  plStack_b0 = (lazy_ostream *)&local_110;
  local_120.m_params = (SerParams *)0xeb314f;
  local_50 = (element_type *)((ulong)local_50 & 0xffffffffffffff00);
  local_58 = &PTR__lazy_ostream_013ac230;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  pcVar9 = "\"102:304:506:708:90a:b0c:d0e:f10\"";
  pcVar7 = "addr.ToStringAddr()";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_110.m_params = (SerParams *)&local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)local_260,1,2,REQUIRE,0xeb694c,(size_t)&local_d8,0x1c0,plVar8
             ,"\"102:304:506:708:90a:b0c:d0e:f10\"",paVar10);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_560 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x1c1;
  file_17.m_begin = (iterator)&local_560;
  msg_17.m_end = pvVar6;
  msg_17.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_570,
             msg_17);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_580 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_578 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  local_58._0_1_ =
       (class_property<bool>)
       (class_property<bool>)((long)pp_Stack_180 - (long)local_188 == sStack_170);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_580,0x1c1,plVar8,pcVar9,paVar10);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_c8 = (undefined1  [8])0x2487c0886bfd1002;
  pDStack_c0 = (DataStream *)0xcabd1bca128197ca;
  local_b8 = (undefined1 *)CONCAT62(local_b8._2_6_,0xc2fa);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_c8 = (undefined1  [8])&local_190;
  pDStack_c0 = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c8);
  local_590 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x1c9;
  file_18.m_begin = (iterator)&local_590;
  msg_18.m_end = pvVar6;
  msg_18.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_5a0,
             msg_18);
  local_58._0_1_ =
       (class_property<bool>)CNetAddr::IsInternal((CNetAddr *)&local_78.indirect_contents);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsInternal()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_5b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_5a8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_5b0,0x1c9);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_5c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x1ca;
  file_19.m_begin = (iterator)&local_5c0;
  msg_19.m_end = pvVar6;
  msg_19.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_5d0,
             msg_19);
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       CNetAddr::IsAddrV1Compatible((CNetAddr *)&local_78.indirect_contents);
  paVar10 = (assertion_result *)&local_58;
  local_58 = (undefined **)
             CONCAT71(local_58._1_7_,
                      rVar2.super_readonly_property<bool>.super_class_property<bool>.value);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsAddrV1Compatible()";
  local_260._8_8_ = "";
  plVar8 = (lazy_ostream *)local_c8;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_5e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_5d8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            (paVar10,plVar8,1,0,WARN,(check_type)pcVar7,(size_t)&local_5e0,0x1ca);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_5f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x1cb;
  file_20.m_begin = (iterator)&local_5f0;
  msg_20.m_end = pvVar6;
  msg_20.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_600,
             msg_20);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_013abb30;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  CNetAddr::ToStringAddr_abi_cxx11_(&local_98,(CNetAddr *)&local_78.indirect_contents);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"zklycewkdo64v6wc.internal");
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 0);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_params = (SerParams *)0xeb1b5a;
  local_d8.m_substream = (DataStream *)0xeb1bbc;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abbf0;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  plStack_b0 = (lazy_ostream *)&local_110;
  local_120.m_params = (SerParams *)0xeb3191;
  local_50 = (element_type *)((ulong)local_50 & 0xffffffffffffff00);
  local_58 = &PTR__lazy_ostream_013ae638;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  pcVar9 = "\"zklycewkdo64v6wc.internal\"";
  pcVar7 = "addr.ToStringAddr()";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_110.m_params = (SerParams *)&local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)local_260,1,2,REQUIRE,0xeb694c,(size_t)&local_d8,0x1cb,plVar8
             ,"\"zklycewkdo64v6wc.internal\"",paVar10);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_610 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_608 = "";
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  local_618 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x1cc;
  file_21.m_begin = (iterator)&local_610;
  msg_21.m_end = pvVar6;
  msg_21.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_620,
             msg_21);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_630 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_628 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  local_58._0_1_ =
       (class_property<bool>)
       (class_property<bool>)((long)pp_Stack_180 - (long)local_188 == sStack_170);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_630,0x1cc,plVar8,pcVar9,paVar10);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_c8._2_6_ = local_c8._2_6_ & 0xffffffffff00;
  local_c8._0_2_ = 0x402;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_640 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x1d3;
  file_22.m_begin = (iterator)&local_640;
  msg_22.m_end = pvVar6;
  msg_22.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_650,
             msg_22);
  local_130.m_params = &local_190;
  local_130.m_substream = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,&local_130);
  local_660 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_658 = "";
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x1d3;
  file_23.m_begin = (iterator)&local_660;
  msg_23.m_end = pvVar6;
  msg_23.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_670,
             msg_23);
  local_58._0_1_ = (class_property<bool>)0x0;
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abd70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  plStack_b0 = (lazy_ostream *)0xe54324;
  local_680 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_678 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_680,0x1d3);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_6c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_6b8 = "";
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0x1d4;
  file_24.m_begin = (iterator)&local_6c0;
  msg_24.m_end = pvVar6;
  msg_24.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_6d0,
             msg_24);
  local_58._0_1_ = (class_property<bool>)((long)pp_Stack_180 - (long)local_188 != sStack_170);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_6e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_6d8 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_6e0,0x1d4);
  boost::detail::shared_count::~shared_count(&sStack_48);
  if ((undefined1  [8])pp_Stack_180 != local_188) {
    pp_Stack_180 = (_func_int **)local_188;
  }
  sStack_170 = 0;
  local_c8 = (undefined1  [8])0x1002;
  pDStack_c0 = (DataStream *)0x201ffff00000000;
  local_b8 = (undefined1 *)CONCAT62(local_b8._2_6_,0x403);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_c8 = (undefined1  [8])&local_190;
  pDStack_c0 = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c8);
  local_6f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_6e8 = "";
  local_700 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x1dc;
  file_25.m_begin = (iterator)&local_6f0;
  msg_25.m_end = pvVar6;
  msg_25.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_700,
             msg_25);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
  local_58._0_1_ = (class_property<bool>)!bVar3;
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!addr.IsValid()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_710 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_708 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_710,0x1dc);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_720 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x1dd;
  file_26.m_begin = (iterator)&local_720;
  msg_26.m_end = pvVar6;
  msg_26.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_730,
             msg_26);
  local_58._0_1_ = (class_property<bool>)((long)pp_Stack_180 - (long)local_188 == sStack_170);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_740 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_738 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_740,0x1dd);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_c8 = (undefined1  [8])0x43eb7ed887fd1002;
  pDStack_c0 = (DataStream *)0x807060504030201;
  local_b8 = (undefined1 *)CONCAT62(local_b8._2_6_,0xa09);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_c8 = (undefined1  [8])&local_190;
  pDStack_c0 = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c8);
  local_750 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_748 = "";
  local_760 = &boost::unit_test::basic_cstring<char_const>::null;
  local_758 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x1e4;
  file_27.m_begin = (iterator)&local_750;
  msg_27.m_end = pvVar6;
  msg_27.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_760,
             msg_27);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
  local_58._0_1_ = (class_property<bool>)!bVar3;
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!addr.IsValid()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_770 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_768 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_770,0x1e4);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_780 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_778 = "";
  local_790 = &boost::unit_test::basic_cstring<char_const>::null;
  local_788 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x1e5;
  file_28.m_begin = (iterator)&local_780;
  msg_28.m_end = pvVar6;
  msg_28.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_790,
             msg_28);
  local_58._0_1_ = (class_property<bool>)((long)pp_Stack_180 - (long)local_188 == sStack_170);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_7a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_798 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_7a0,0x1e5);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_c8 = (undefined1  [8])0xf6f5f4f3f2f10a03;
  pDStack_c0 = (DataStream *)CONCAT44(pDStack_c0._4_4_,0xfaf9f8f7);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_c8 = (undefined1  [8])&local_190;
  pDStack_c0 = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c8);
  local_7b0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_7a8 = "";
  local_7c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x1ec;
  file_29.m_begin = (iterator)&local_7b0;
  msg_29.m_end = pvVar6;
  msg_29.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_7c0,
             msg_29);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
  local_58._0_1_ = (class_property<bool>)!bVar3;
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!addr.IsValid()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_7d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_7c8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_7d0,0x1ec);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_7e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x1ed;
  file_30.m_begin = (iterator)&local_7e0;
  msg_30.m_end = pvVar6;
  msg_30.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_7f0,
             msg_30);
  local_58._0_1_ = (class_property<bool>)((long)pp_Stack_180 - (long)local_188 == sStack_170);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_800 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_7f8 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_800,0x1ed);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_b8 = (undefined1 *)0xb16f55f6f769046b;
  plStack_b0 = (lazy_ostream *)0xa3dd409ba78931ac;
  local_c8 = (undefined1  [8])0x4b1825c6bc792004;
  pDStack_c0 = (DataStream *)0xb6668bc275491905;
  local_a8 = 0x1f2f;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_c8 = (undefined1  [8])&local_190;
  pDStack_c0 = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c8);
  local_810 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_808 = "";
  local_820 = &boost::unit_test::basic_cstring<char_const>::null;
  local_818 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x1f5;
  file_31.m_begin = (iterator)&local_810;
  msg_31.m_end = pvVar6;
  msg_31.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_820,
             msg_31);
  local_58._0_1_ = (class_property<bool>)CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsValid()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_830 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_828 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_830,0x1f5);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_840 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_838 = "";
  local_850 = &boost::unit_test::basic_cstring<char_const>::null;
  local_848 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x1f6;
  file_32.m_begin = (iterator)&local_840;
  msg_32.m_end = pvVar6;
  msg_32.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_850,
             msg_32);
  local_58._0_1_ = (class_property<bool>)(local_60 == 3);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsTor()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_860 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_858 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_860,0x1f6);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_870 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_868 = "";
  local_880 = &boost::unit_test::basic_cstring<char_const>::null;
  local_878 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x1f7;
  file_33.m_begin = (iterator)&local_870;
  msg_33.m_end = pvVar6;
  msg_33.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_880,
             msg_33);
  bVar3 = CNetAddr::IsAddrV1Compatible((CNetAddr *)&local_78.indirect_contents);
  paVar10 = (assertion_result *)&local_58;
  local_58 = (undefined **)CONCAT71(local_58._1_7_,!bVar3);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!addr.IsAddrV1Compatible()";
  local_260._8_8_ = "";
  plVar8 = (lazy_ostream *)local_c8;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_890 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_888 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            (paVar10,plVar8,1,0,WARN,(check_type)pcVar7,(size_t)&local_890,0x1f7);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_8a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_898 = "";
  local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0x1f9;
  file_34.m_begin = (iterator)&local_8a0;
  msg_34.m_end = pvVar6;
  msg_34.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_8b0,
             msg_34);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_013abb30;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  CNetAddr::ToStringAddr_abi_cxx11_(&local_98,(CNetAddr *)&local_78.indirect_contents);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion");
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 0);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_params = (SerParams *)0xeb1b5a;
  local_d8.m_substream = (DataStream *)0xeb1bbc;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abbf0;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  plStack_b0 = (lazy_ostream *)&local_110;
  local_120.m_params = (SerParams *)0xe7f9da;
  local_50 = (element_type *)((ulong)local_50 & 0xffffffffffffff00);
  local_58 = &PTR__lazy_ostream_013ae7b8;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_40 = &local_120;
  pcVar9 = "\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\"";
  pcVar7 = "addr.ToStringAddr()";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_110.m_params = (SerParams *)&local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)local_260,1,2,REQUIRE,0xeb694c,(size_t)&local_d8,0x1f9,plVar8
             ,"\"pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion\"",paVar10);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_8c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_8b8 = "";
  local_8d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0x1fa;
  file_35.m_begin = (iterator)&local_8c0;
  msg_35.m_end = pvVar6;
  msg_35.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_8d0,
             msg_35);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_8e0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_8d8 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  local_58._0_1_ =
       (class_property<bool>)
       (class_property<bool>)((long)pp_Stack_180 - (long)local_188 == sStack_170);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_8e0,0x1fa,plVar8,pcVar9,paVar10);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_c8._2_6_ = local_c8._2_6_ & 0xffffffffff00;
  local_c8._0_2_ = 4;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_8f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_8e8 = "";
  local_900 = &boost::unit_test::basic_cstring<char_const>::null;
  local_8f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0x201;
  file_36.m_begin = (iterator)&local_8f0;
  msg_36.m_end = pvVar6;
  msg_36.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_900,
             msg_36);
  local_120.m_params = &local_190;
  local_120.m_substream = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,&local_120);
  local_910 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_908 = "";
  local_920 = &boost::unit_test::basic_cstring<char_const>::null;
  local_918 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0x201;
  file_37.m_begin = (iterator)&local_910;
  msg_37.m_end = pvVar6;
  msg_37.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_920,
             msg_37);
  local_58._0_1_ = (class_property<bool>)0x0;
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abd70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  plStack_b0 = (lazy_ostream *)0xe54324;
  local_930 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_928 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_930,0x201);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_970 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_968 = "";
  local_980 = &boost::unit_test::basic_cstring<char_const>::null;
  local_978 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0x202;
  file_38.m_begin = (iterator)&local_970;
  msg_38.m_end = pvVar6;
  msg_38.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_980,
             msg_38);
  local_58._0_1_ = (class_property<bool>)((long)pp_Stack_180 - (long)local_188 != sStack_170);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_990 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_988 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_990,0x202);
  boost::detail::shared_count::~shared_count(&sStack_48);
  if ((undefined1  [8])pp_Stack_180 != local_188) {
    pp_Stack_180 = (_func_int **)local_188;
  }
  sStack_170 = 0;
  local_b8 = (undefined1 *)0xd442ae3282f9648b;
  plStack_b0 = (lazy_ostream *)0xe3df5219a82ffdb6;
  local_c8 = (undefined1  [8])0xc0aeab4d89a22005;
  pDStack_c0 = (DataStream *)0xc8daa681a451008c;
  local_a8 = 0x876a;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_c8 = (undefined1  [8])&local_190;
  pDStack_c0 = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c8);
  local_9a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_998 = "";
  local_9b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0x20b;
  file_39.m_begin = (iterator)&local_9a0;
  msg_39.m_end = pvVar6;
  msg_39.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_9b0,
             msg_39);
  local_58._0_1_ = (class_property<bool>)CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsValid()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_9c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_9b8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_9c0,0x20b);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_9d0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_9c8 = "";
  local_9e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_9d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0x20c;
  file_40.m_begin = (iterator)&local_9d0;
  msg_40.m_end = pvVar6;
  msg_40.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_9e0,
             msg_40);
  local_58._0_1_ = (class_property<bool>)(local_60 == 4);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsI2P()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_9f0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_9e8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_9f0,0x20c);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_a00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_9f8 = "";
  local_a10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a08 = &boost::unit_test::basic_cstring<char_const>::null;
  file_41.m_end = (iterator)0x20d;
  file_41.m_begin = (iterator)&local_a00;
  msg_41.m_end = pvVar6;
  msg_41.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_41,(size_t)&local_a10,
             msg_41);
  bVar3 = CNetAddr::IsAddrV1Compatible((CNetAddr *)&local_78.indirect_contents);
  paVar10 = (assertion_result *)&local_58;
  local_58 = (undefined **)CONCAT71(local_58._1_7_,!bVar3);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!addr.IsAddrV1Compatible()";
  local_260._8_8_ = "";
  plVar8 = (lazy_ostream *)local_c8;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_a20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_a18 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            (paVar10,plVar8,1,0,WARN,(check_type)pcVar7,(size_t)&local_a20,0x20d);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_a30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_a28 = "";
  local_a40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_42.m_end = (iterator)0x20f;
  file_42.m_begin = (iterator)&local_a30;
  msg_42.m_end = pvVar6;
  msg_42.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_42,(size_t)&local_a40,
             msg_42);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_013abb30;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  CNetAddr::ToStringAddr_abi_cxx11_(&local_98,(CNetAddr *)&local_78.indirect_contents);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"ukeu3k5oycgaauneqgtnvselmt4yemvoilkln7jpvamvfx7dnkdq.b32.i2p");
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 0);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_params = (SerParams *)0xeb1b5a;
  local_d8.m_substream = (DataStream *)0xeb1bbc;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abbf0;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  plStack_b0 = (lazy_ostream *)&local_110;
  local_40 = (ParamsStream<DataStream_&,_CAddress::SerParams> *)&local_f8;
  local_f8 = (string *)0xeb33c4;
  local_50 = (element_type *)((ulong)local_50 & 0xffffffffffffff00);
  local_58 = &PTR__lazy_ostream_013ae838;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcVar9 = "\"ukeu3k5oycgaauneqgtnvselmt4yemvoilkln7jpvamvfx7dnkdq.b32.i2p\"";
  pcVar7 = "addr.ToStringAddr()";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_110.m_params = (SerParams *)&local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)local_260,1,2,REQUIRE,0xeb694c,(size_t)&local_d8,0x20f,plVar8
             ,"\"ukeu3k5oycgaauneqgtnvselmt4yemvoilkln7jpvamvfx7dnkdq.b32.i2p\"",paVar10);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_a50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_a48 = "";
  local_a60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a58 = &boost::unit_test::basic_cstring<char_const>::null;
  file_43.m_end = (iterator)0x210;
  file_43.m_begin = (iterator)&local_a50;
  msg_43.m_end = pvVar6;
  msg_43.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_43,(size_t)&local_a60,
             msg_43);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_a70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_a68 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  local_58._0_1_ =
       (class_property<bool>)
       (class_property<bool>)((long)pp_Stack_180 - (long)local_188 == sStack_170);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_a70,0x210,plVar8,pcVar9,paVar10);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_c8._2_6_ = local_c8._2_6_ & 0xffffffffff00;
  local_c8._0_2_ = 0x305;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_a80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_a78 = "";
  local_a90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a88 = &boost::unit_test::basic_cstring<char_const>::null;
  file_44.m_end = (iterator)0x217;
  file_44.m_begin = (iterator)&local_a80;
  msg_44.m_end = pvVar6;
  msg_44.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_44,(size_t)&local_a90,
             msg_44);
  local_110.m_params = &local_190;
  local_110.m_substream = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,&local_110);
  local_aa0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_a98 = "";
  local_ab0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_aa8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_45.m_end = (iterator)0x217;
  file_45.m_begin = (iterator)&local_aa0;
  msg_45.m_end = pvVar6;
  msg_45.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_45,(size_t)&local_ab0,
             msg_45);
  local_58._0_1_ = (class_property<bool>)0x0;
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abd70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  plStack_b0 = (lazy_ostream *)0xe54324;
  local_ac0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_ab8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_ac0,0x217);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_b00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_af8 = "";
  local_b10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b08 = &boost::unit_test::basic_cstring<char_const>::null;
  file_46.m_end = (iterator)0x218;
  file_46.m_begin = (iterator)&local_b00;
  msg_46.m_end = pvVar6;
  msg_46.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_46,(size_t)&local_b10,
             msg_46);
  local_58._0_1_ = (class_property<bool>)((long)pp_Stack_180 - (long)local_188 != sStack_170);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_b18 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_b20,0x218);
  boost::detail::shared_count::~shared_count(&sStack_48);
  if ((undefined1  [8])pp_Stack_180 != local_188) {
    pp_Stack_180 = (_func_int **)local_188;
  }
  sStack_170 = 0;
  local_c8 = (undefined1  [8])0x200010000fc1006;
  pDStack_c0 = (DataStream *)0x600050004000300;
  local_b8 = (undefined1 *)CONCAT62(local_b8._2_6_,0x700);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_c8 = (undefined1  [8])&local_190;
  pDStack_c0 = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c8);
  local_b30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_b28 = "";
  local_b40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_47.m_end = (iterator)0x220;
  file_47.m_begin = (iterator)&local_b30;
  msg_47.m_end = pvVar6;
  msg_47.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_47,(size_t)&local_b40,
             msg_47);
  local_58._0_1_ = (class_property<bool>)CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsValid()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_b48 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_b50,0x220);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_b60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_b58 = "";
  local_b70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b68 = &boost::unit_test::basic_cstring<char_const>::null;
  file_48.m_end = (iterator)0x221;
  file_48.m_begin = (iterator)&local_b60;
  msg_48.m_end = pvVar6;
  msg_48.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_48,(size_t)&local_b70,
             msg_48);
  local_58._0_1_ = (class_property<bool>)(local_60 == 5);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsCJDNS()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_b80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_b78 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_b80,0x221);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_b90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_b88 = "";
  local_ba0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b98 = &boost::unit_test::basic_cstring<char_const>::null;
  file_49.m_end = (iterator)0x222;
  file_49.m_begin = (iterator)&local_b90;
  msg_49.m_end = pvVar6;
  msg_49.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_49,(size_t)&local_ba0,
             msg_49);
  bVar3 = CNetAddr::IsAddrV1Compatible((CNetAddr *)&local_78.indirect_contents);
  paVar10 = (assertion_result *)&local_58;
  local_58 = (undefined **)CONCAT71(local_58._1_7_,!bVar3);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!addr.IsAddrV1Compatible()";
  local_260._8_8_ = "";
  plVar8 = (lazy_ostream *)local_c8;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_bb0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_ba8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            (paVar10,plVar8,1,0,WARN,(check_type)pcVar7,(size_t)&local_bb0,0x222);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_bc0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_bb8 = "";
  local_bd0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_bc8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_50.m_end = (iterator)0x223;
  file_50.m_begin = (iterator)&local_bc0;
  msg_50.m_end = pvVar6;
  msg_50.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_50,(size_t)&local_bd0,
             msg_50);
  local_260._8_8_ = local_260._8_8_ & 0xffffffffffffff00;
  local_260._0_8_ = &PTR__lazy_ostream_013abb30;
  local_250 = boost::unit_test::lazy_ostream::inst;
  local_248 = "";
  CNetAddr::ToStringAddr_abi_cxx11_(&local_98,(CNetAddr *)&local_78.indirect_contents);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_98,"fc00:1:2:3:4:5:6:7");
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(iVar4 == 0);
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d8.m_params = (SerParams *)0xeb1b5a;
  local_d8.m_substream = (DataStream *)0xeb1bbc;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abbf0;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  plStack_b0 = (lazy_ostream *)&local_f8;
  local_40 = (ParamsStream<DataStream_&,_CAddress::SerParams> *)&local_100;
  local_100 = "fc00:1:2:3:4:5:6:7";
  local_50 = (element_type *)((ulong)local_50 & 0xffffffffffffff00);
  local_58 = &PTR__lazy_ostream_013abf10;
  sStack_48.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pcVar9 = "\"fc00:1:2:3:4:5:6:7\"";
  pcVar7 = "addr.ToStringAddr()";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_f8 = &local_98;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,(lazy_ostream *)local_260,1,2,REQUIRE,0xeb694c,(size_t)&local_d8,0x223,plVar8
             ,"\"fc00:1:2:3:4:5:6:7\"",paVar10);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  local_be0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_bd8 = "";
  local_bf0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_be8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_51.m_end = (iterator)0x224;
  file_51.m_begin = (iterator)&local_be0;
  msg_51.m_end = pvVar6;
  msg_51.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_51,(size_t)&local_bf0,
             msg_51);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_c00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_bf8 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  local_58._0_1_ =
       (class_property<bool>)
       (class_property<bool>)((long)pp_Stack_180 - (long)local_188 == sStack_170);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_c00,0x224,plVar8,pcVar9,paVar10);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_c8 = (undefined1  [8])0x200010000aa1006;
  pDStack_c0 = (DataStream *)0x600050004000300;
  local_b8 = (undefined1 *)CONCAT62(local_b8._2_6_,0x700);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_c8 = (undefined1  [8])&local_190;
  pDStack_c0 = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c8);
  local_c10 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_c08 = "";
  local_c20 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c18 = &boost::unit_test::basic_cstring<char_const>::null;
  file_52.m_end = (iterator)0x22b;
  file_52.m_begin = (iterator)&local_c10;
  msg_52.m_end = pvVar6;
  msg_52.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_52,(size_t)&local_c20,
             msg_52);
  local_58._0_1_ = (class_property<bool>)(local_60 == 5);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "addr.IsCJDNS()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_c30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_c28 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_c30,0x22b);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_c40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_c38 = "";
  local_c50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c48 = &boost::unit_test::basic_cstring<char_const>::null;
  file_53.m_end = (iterator)0x22c;
  file_53.m_begin = (iterator)&local_c40;
  msg_53.m_end = pvVar6;
  msg_53.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_53,(size_t)&local_c50,
             msg_53);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
  local_58._0_1_ = (class_property<bool>)!bVar3;
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!addr.IsValid()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_c60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_c58 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_c60,0x22c);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_c70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_c68 = "";
  local_c80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_54.m_end = (iterator)0x22d;
  file_54.m_begin = (iterator)&local_c70;
  msg_54.m_end = pvVar6;
  msg_54.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_54,(size_t)&local_c80,
             msg_54);
  local_58._0_1_ = (class_property<bool>)((long)pp_Stack_180 - (long)local_188 == sStack_170);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_c90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_c88 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_c90,0x22d);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_c8._2_6_ = local_c8._2_6_ & 0xffffffffff00;
  local_c8._0_2_ = 0x106;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_ca0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_c98 = "";
  local_cb0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_ca8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_55.m_end = (iterator)0x234;
  file_55.m_begin = (iterator)&local_ca0;
  msg_55.m_end = pvVar6;
  msg_55.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_55,(size_t)&local_cb0,
             msg_55);
  local_d8.m_params = &local_190;
  local_d8.m_substream = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,&local_d8);
  local_cc0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_cb8 = "";
  local_cd0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_cc8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_56.m_end = (iterator)0x234;
  file_56.m_begin = (iterator)&local_cc0;
  msg_56.m_end = pvVar6;
  msg_56.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_56,(size_t)&local_cd0,
             msg_56);
  local_58._0_1_ = (class_property<bool>)0x0;
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abd70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  plStack_b0 = (lazy_ostream *)0xe54324;
  local_ce0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_cd8 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_ce0,0x234);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_d20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_d18 = "";
  local_d30 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d28 = &boost::unit_test::basic_cstring<char_const>::null;
  file_57.m_end = (iterator)0x235;
  file_57.m_begin = (iterator)&local_d20;
  msg_57.m_end = pvVar6;
  msg_57.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_57,(size_t)&local_d30,
             msg_57);
  local_58._0_1_ = (class_property<bool>)((long)pp_Stack_180 - (long)local_188 != sStack_170);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_d40 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_d38 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_d40,0x235);
  boost::detail::shared_count::~shared_count(&sStack_48);
  if ((undefined1  [8])pp_Stack_180 != local_188) {
    pp_Stack_180 = (_func_int **)local_188;
  }
  sStack_170 = 0;
  local_c8 = (undefined1  [8])0x20102000000feaa;
  pDStack_c0 = (DataStream *)CONCAT35(pDStack_c0._5_3_,0x700000000);
  pDStack_c0 = (DataStream *)CONCAT44(pDStack_c0._4_4_,0x6050403);
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_d50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_d48 = "";
  local_d60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d58 = &boost::unit_test::basic_cstring<char_const>::null;
  file_58.m_end = (iterator)0x23d;
  file_58.m_begin = (iterator)&local_d50;
  msg_58.m_end = pvVar6;
  msg_58.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_58,(size_t)&local_d60,
             msg_58);
  local_f0._0_8_ = &local_190;
  local_f0.m_message.px = (element_type *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)&local_f0);
  local_d70 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_d68 = "";
  local_d80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d78 = &boost::unit_test::basic_cstring<char_const>::null;
  file_59.m_end = (iterator)0x23d;
  file_59.m_begin = (iterator)&local_d70;
  msg_59.m_end = pvVar6;
  msg_59.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_59,(size_t)&local_d80,
             msg_59);
  local_58._0_1_ = (class_property<bool>)0x0;
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abd70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  plStack_b0 = (lazy_ostream *)0xe54324;
  local_d90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_d88 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x1;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,1,WARN,(check_type)pcVar7,
             (size_t)&local_d90,0x23d);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_dd0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_dc8 = "";
  local_de0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_dd8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_60.m_end = (iterator)0x23e;
  file_60.m_begin = (iterator)&local_dd0;
  msg_60.m_end = pvVar6;
  msg_60.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_60,(size_t)&local_de0,
             msg_60);
  local_58._0_1_ = (class_property<bool>)((long)pp_Stack_180 - (long)local_188 != sStack_170);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_df0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_de8 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_df0,0x23e);
  boost::detail::shared_count::~shared_count(&sStack_48);
  if ((undefined1  [8])pp_Stack_180 != local_188) {
    pp_Stack_180 = (_func_int **)local_188;
  }
  sStack_170 = 0;
  local_c8._0_6_ = 0x403020104aa;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_c8 = (undefined1  [8])&local_190;
  pDStack_c0 = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c8);
  local_e00 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_df8 = "";
  local_e10 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e08 = &boost::unit_test::basic_cstring<char_const>::null;
  file_61.m_end = (iterator)0x246;
  file_61.m_begin = (iterator)&local_e00;
  msg_61.m_end = pvVar6;
  msg_61.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_61,(size_t)&local_e10,
             msg_61);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
  local_58._0_1_ = (class_property<bool>)!bVar3;
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!addr.IsValid()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_e20 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_e18 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_e20,0x246);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_e30 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_e28 = "";
  local_e40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e38 = &boost::unit_test::basic_cstring<char_const>::null;
  file_62.m_end = (iterator)0x247;
  file_62.m_begin = (iterator)&local_e30;
  msg_62.m_end = pvVar6;
  msg_62.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_62,(size_t)&local_e40,
             msg_62);
  local_58._0_1_ = (class_property<bool>)((long)pp_Stack_180 - (long)local_188 == sStack_170);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_e50 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_e48 = "";
  pvVar5 = (iterator)0x2;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_e50,0x247);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_c8._0_2_ = 0xaa;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)local_188,pp_Stack_180,
             local_c8);
  local_c8 = (undefined1  [8])&local_190;
  pDStack_c0 = (DataStream *)local_188;
  CNetAddr::Unserialize<ParamsStream<DataStream&,CAddress::SerParams>>
            ((CNetAddr *)&local_78.indirect_contents,
             (ParamsStream<DataStream_&,_CAddress::SerParams> *)local_c8);
  local_e60 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_e58 = "";
  local_e70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e68 = &boost::unit_test::basic_cstring<char_const>::null;
  file_63.m_end = (iterator)0x24e;
  file_63.m_begin = (iterator)&local_e60;
  msg_63.m_end = pvVar6;
  msg_63.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_63,(size_t)&local_e70,
             msg_63);
  bVar3 = CNetAddr::IsValid((CNetAddr *)&local_78.indirect_contents);
  local_58._0_1_ = (class_property<bool>)!bVar3;
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "!addr.IsValid()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_e80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_e78 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,1,0,WARN,(check_type)pcVar7,
             (size_t)&local_e80,0x24e);
  boost::detail::shared_count::~shared_count(&sStack_48);
  local_e90 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_e88 = "";
  local_ea0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e98 = &boost::unit_test::basic_cstring<char_const>::null;
  file_64.m_end = (iterator)0x24f;
  file_64.m_begin = (iterator)&local_e90;
  msg_64.m_end = pvVar6;
  msg_64.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_64,(size_t)&local_ea0,
             msg_64);
  local_58 = (undefined **)
             CONCAT71(local_58._1_7_,(long)pp_Stack_180 - (long)local_188 == sStack_170);
  local_50 = (element_type *)0x0;
  sStack_48.pi_ = (sp_counted_base *)0x0;
  local_260._0_8_ = "s.empty()";
  local_260._8_8_ = "";
  pDStack_c0 = (DataStream *)((ulong)pDStack_c0 & 0xffffffffffffff00);
  local_c8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
  local_b8 = boost::unit_test::lazy_ostream::inst;
  local_eb0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/net_tests.cpp"
  ;
  local_ea8 = "";
  plStack_b0 = (lazy_ostream *)local_260;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_58,(lazy_ostream *)local_c8,2,0,WARN,(check_type)pcVar7,
             (size_t)&local_eb0,0x24f);
  boost::detail::shared_count::~shared_count(&sStack_48);
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)local_188);
  if (0x10 < local_68) {
    free(local_78.indirect_contents.indirect);
    local_78.indirect_contents.indirect = (char *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(cnetaddr_unserialize_v2)
{
    CNetAddr addr;
    DataStream s{};
    const auto ser_params{CAddress::V2_NETWORK};

    // Valid IPv4.
    s << "01"            // network type (IPv4)
         "04"            // address length
         "01020304"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsIPv4());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "1.2.3.4");
    BOOST_REQUIRE(s.empty());

    // Invalid IPv4, valid length but address itself is shorter.
    s << "01"        // network type (IPv4)
         "04"        // address length
         "0102"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure, HasReason("end of data"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Invalid IPv4, with bogus length.
    s << "01"            // network type (IPv4)
         "05"            // address length
         "01020304"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 IPv4 address with length 5 (should be 4)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Invalid IPv4, with extreme length.
    s << "01"            // network type (IPv4)
         "fd0102"        // address length (513 as CompactSize)
         "01020304"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("Address too long: 513 > 512"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Valid IPv6.
    s << "02"                                    // network type (IPv6)
         "10"                                    // address length
         "0102030405060708090a0b0c0d0e0f10"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsIPv6());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "102:304:506:708:90a:b0c:d0e:f10");
    BOOST_REQUIRE(s.empty());

    // Valid IPv6, contains embedded "internal".
    s << "02"                                    // network type (IPv6)
         "10"                                    // address length
         "fd6b88c08724ca978112ca1bbdcafac2"_hex; // address: 0xfd + sha256("bitcoin")[0:5] +
                                                 // sha256(name)[0:10]
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsInternal());
    BOOST_CHECK(addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "zklycewkdo64v6wc.internal");
    BOOST_REQUIRE(s.empty());

    // Invalid IPv6, with bogus length.
    s << "02"      // network type (IPv6)
         "04"      // address length
         "00"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 IPv6 address with length 4 (should be 16)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Invalid IPv6, contains embedded IPv4.
    s << "02"                                    // network type (IPv6)
         "10"                                    // address length
         "00000000000000000000ffff01020304"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // Invalid IPv6, contains embedded TORv2.
    s << "02"                                    // network type (IPv6)
         "10"                                    // address length
         "fd87d87eeb430102030405060708090a"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // TORv2, no longer supported.
    s << "03"                        // network type (TORv2)
         "0a"                        // address length
         "f1f2f3f4f5f6f7f8f9fa"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // Valid TORv3.
    s << "04"                               // network type (TORv3)
         "20"                               // address length
         "79bcc625184b05194975c28b66b66b04" // address
         "69f7f6556fb1ac3189a79b40dda32f1f"_hex;
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsTor());
    BOOST_CHECK(!addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(),
                      "pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion");
    BOOST_REQUIRE(s.empty());

    // Invalid TORv3, with bogus length.
    s << "04"      // network type (TORv3)
         "00"      // address length
         "00"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 TORv3 address with length 0 (should be 32)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Valid I2P.
    s << "05"                               // network type (I2P)
         "20"                               // address length
         "a2894dabaec08c0051a481a6dac88b64" // address
         "f98232ae42d4b6fd2fa81952dfe36a87"_hex;
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsI2P());
    BOOST_CHECK(!addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(),
                      "ukeu3k5oycgaauneqgtnvselmt4yemvoilkln7jpvamvfx7dnkdq.b32.i2p");
    BOOST_REQUIRE(s.empty());

    // Invalid I2P, with bogus length.
    s << "05"      // network type (I2P)
         "03"      // address length
         "00"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 I2P address with length 3 (should be 32)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Valid CJDNS.
    s << "06"                                    // network type (CJDNS)
         "10"                                    // address length
         "fc000001000200030004000500060007"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsValid());
    BOOST_CHECK(addr.IsCJDNS());
    BOOST_CHECK(!addr.IsAddrV1Compatible());
    BOOST_CHECK_EQUAL(addr.ToStringAddr(), "fc00:1:2:3:4:5:6:7");
    BOOST_REQUIRE(s.empty());

    // Invalid CJDNS, wrong prefix.
    s << "06"                                    // network type (CJDNS)
         "10"                                    // address length
         "aa000001000200030004000500060007"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(addr.IsCJDNS());
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // Invalid CJDNS, with bogus length.
    s << "06"      // network type (CJDNS)
         "01"      // address length
         "00"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("BIP155 CJDNS address with length 1 (should be 16)"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Unknown, with extreme length.
    s << "aa"                  // network type (unknown)
         "fe00000002"          // address length (CompactSize's MAX_SIZE)
         "01020304050607"_hex; // address
    BOOST_CHECK_EXCEPTION(s >> ser_params(addr), std::ios_base::failure,
                          HasReason("Address too long: 33554432 > 512"));
    BOOST_REQUIRE(!s.empty()); // The stream is not consumed on invalid input.
    s.clear();

    // Unknown, with reasonable length.
    s << "aa"            // network type (unknown)
         "04"            // address length
         "01020304"_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());

    // Unknown, with zero length.
    s << "aa"    // network type (unknown)
         "00"    // address length
         ""_hex; // address
    s >> ser_params(addr);
    BOOST_CHECK(!addr.IsValid());
    BOOST_REQUIRE(s.empty());
}